

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::VerifyLargeAllocZeroFill
          (Recycler *this,void *address,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    if (*address != &PTR_Finalize_01362770) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e82,"((*(void**)(&dummy)) == *((void**)address))",
                         "(*(void**)(&dummy)) == *((void**)address)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    address = (void *)((long)address + 8);
    size = size - 8;
  }
  VerifyZeroFill(this,address,size);
  return;
}

Assistant:

void
Recycler::VerifyLargeAllocZeroFill(void * address, size_t size, ObjectInfoBits attributes)
{
    // Large allocs will have already written the dummy vtable at the beginning of the allocation
    // if either FinalizeBit or TrackBit attributes were set. Skip the verify for that memory
    // if that is the case.
    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Verify that it really is the dummy v-table before skipping it.
        DummyVTableObject dummy;
        Assert((*(void**)(&dummy)) == *((void**)address));

        address = ((char*)address) + sizeof(DummyVTableObject);
        size -= sizeof(DummyVTableObject);
    }
    VerifyZeroFill(address, size);
}